

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_sync(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  Byte *local_a0;
  z_stream d_stream;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  strcpy((char *)uncompr,"garbage");
  d_stream.state = (internal_state *)zalloc;
  d_stream.zalloc = (alloc_func)zfree;
  d_stream.zfree = (free_func)0x0;
  d_stream.next_in._0_4_ = 2;
  local_a0 = compr;
  d_stream.reserved._4_4_ = inflateInit_(&local_a0,"1.2.8",0x70);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateInit",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  d_stream.next_out._0_4_ = (undefined4)uncomprLen;
  d_stream.total_in = (uLong)uncompr;
  inflate(&local_a0,0);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflate",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  d_stream.next_in._0_4_ = (int)comprLen + -2;
  d_stream.reserved._4_4_ = inflateSync(&local_a0);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateSync",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  d_stream.reserved._4_4_ = inflate(&local_a0,4);
  if (d_stream.reserved._4_4_ != -3) {
    fprintf(_stderr,"inflate should report DATA_ERROR\n");
    exit(1);
  }
  d_stream.reserved._4_4_ = inflateEnd(&local_a0);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateEnd",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  printf("after inflateSync(): hel%s\n",uncompr);
  return;
}

Assistant:

void test_sync(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 2; /* just read the zlib header */

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    inflate(&d_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "inflate");

    d_stream.avail_in = (uInt)comprLen-2;   /* read all compressed data */
    err = inflateSync(&d_stream);           /* but skip the damaged part */
    CHECK_ERR(err, "inflateSync");

    err = inflate(&d_stream, Z_FINISH);
    if (err != Z_DATA_ERROR) {
        fprintf(stderr, "inflate should report DATA_ERROR\n");
        /* Because of incorrect adler32 */
        exit(1);
    }
    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    printf("after inflateSync(): hel%s\n", (char *)uncompr);
}